

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
WriteCallArg(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
             *this,Expr arg)

{
  ulong uVar1;
  Writer *pWVar2;
  size_t sVar3;
  byte bVar4;
  Buffer<char> *pBVar5;
  ExprBase EVar6;
  byte *pbVar7;
  
  if ((arg.super_ExprBase.impl_ != (Impl *)0x0) &&
     (0xffffffd0 < *(int *)arg.super_ExprBase.impl_ - 0x30U)) {
    Visit(this,(NumericExpr)arg.super_ExprBase.impl_,0);
    return;
  }
  pBVar5 = this->writer_->buffer_;
  sVar3 = pBVar5->size_;
  uVar1 = sVar3 + 1;
  if (pBVar5->capacity_ < uVar1) {
    (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
    sVar3 = pBVar5->size_;
  }
  pBVar5->ptr_[sVar3] = '\'';
  pBVar5->size_ = uVar1;
  EVar6.impl_ = (Impl *)0x0;
  if (*(int *)arg.super_ExprBase.impl_ == 0x46) {
    EVar6.impl_ = (Impl *)arg.super_ExprBase.impl_;
  }
  pbVar7 = (byte *)(EVar6.impl_ + 1);
  do {
    bVar4 = *pbVar7;
    if (bVar4 == 10) {
      pWVar2 = this->writer_;
      pBVar5 = pWVar2->buffer_;
      sVar3 = pBVar5->size_;
      if (sVar3 == pBVar5->capacity_) {
        (**pBVar5->_vptr_Buffer)(pBVar5,sVar3 + 1);
        sVar3 = pBVar5->size_;
      }
      pBVar5->size_ = sVar3 + 1;
      pBVar5->ptr_[sVar3] = '\\';
      pBVar5 = pWVar2->buffer_;
      sVar3 = pBVar5->size_;
      bVar4 = 10;
    }
    else {
      if (bVar4 == 0x27) {
        pBVar5 = this->writer_->buffer_;
        sVar3 = pBVar5->size_;
        if (sVar3 == pBVar5->capacity_) {
          (**pBVar5->_vptr_Buffer)(pBVar5,sVar3 + 1);
          sVar3 = pBVar5->size_;
        }
        pBVar5->size_ = sVar3 + 1;
        pBVar5->ptr_[sVar3] = '\'';
      }
      else if (bVar4 == 0) {
        pBVar5 = this->writer_->buffer_;
        sVar3 = pBVar5->size_;
        uVar1 = sVar3 + 1;
        if (pBVar5->capacity_ < uVar1) {
          (**pBVar5->_vptr_Buffer)(pBVar5,uVar1);
          sVar3 = pBVar5->size_;
        }
        pBVar5->ptr_[sVar3] = '\'';
        pBVar5->size_ = uVar1;
        return;
      }
      pBVar5 = this->writer_->buffer_;
      sVar3 = pBVar5->size_;
    }
    if (sVar3 == pBVar5->capacity_) {
      (**pBVar5->_vptr_Buffer)(pBVar5,sVar3 + 1);
      sVar3 = pBVar5->size_;
    }
    pBVar5->size_ = sVar3 + 1;
    pBVar5->ptr_[sVar3] = bVar4;
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteCallArg(Expr arg) {
  if (NumericExpr e = ExprTypes::template Cast<NumericExpr>(arg)) {
    Visit(e, prec::UNKNOWN);
    return;
  }
  assert(arg.kind() == expr::STRING);
  writer_ << "'";
  const char *s = ExprTypes::template Cast<StringLiteral>(arg).value();
  for ( ; *s; ++s) {
    char c = *s;
    switch (c) {
    case '\n':
      writer_ << '\\' << c;
      break;
    case '\'':
      // Escape quote by doubling.
      writer_ << c;
      // Fall through.
    default:
      writer_ << c;
    }
  }
  writer_ << "'";
}